

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_max_u_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  lVar2 = (ulong)wd * 0x10;
  lVar4 = (ulong)ws * 0x10;
  lVar3 = (ulong)wt * 0x10;
  uVar5 = (env->active_fpu).fpr[ws].fs[0];
  uVar1 = (env->active_fpu).fpr[wt].fs[0];
  if (uVar5 < uVar1) {
    uVar5 = uVar1;
  }
  (env->active_fpu).fpr[wd].fs[0] = uVar5;
  uVar5 = *(uint *)((long)(env->active_fpu).fpr + lVar4 + 4);
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar3 + 4);
  if (uVar5 < uVar1) {
    uVar5 = uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + lVar2 + 4) = uVar5;
  uVar5 = *(uint *)((long)(env->active_fpu).fpr + lVar4 + 8);
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar3 + 8);
  if (uVar5 < uVar1) {
    uVar5 = uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + lVar2 + 8) = uVar5;
  uVar5 = *(uint *)((long)(env->active_fpu).fpr + lVar4 + 0xc);
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  if (uVar5 < uVar1) {
    uVar5 = uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = uVar5;
  return;
}

Assistant:

void helper_msa_max_u_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_max_u_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_max_u_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_max_u_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_max_u_df(DF_WORD, pws->w[3],  pwt->w[3]);
}